

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O3

void __thiscall obx::Transaction::success(Transaction *this)

{
  int err;
  
  if (this->cTxn_ == (OBX_txn *)0x0) {
    internal::throwIllegalStateException("State condition failed: ","txn");
  }
  this->cTxn_ = (OBX_txn *)0x0;
  err = obx_txn_success();
  if (err == 0) {
    return;
  }
  internal::throwLastError(err,(char *)0x0);
}

Assistant:

void Transaction::success() {
    OBX_txn* txn = cTxn_;
    OBX_VERIFY_STATE(txn);
    cTxn_ = nullptr;
    internal::checkErrOrThrow(obx_txn_success(txn));
}